

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int lyp_check_import(lys_module *module,char *value,lys_import *imp)

{
  uint8_t uVar1;
  int iVar2;
  lys_module *plVar3;
  LY_ERR *pLVar4;
  char *revision;
  long lVar5;
  lys_module *plVar6;
  
  if ((ulong)module->imp_size != 0) {
    lVar5 = 0;
    do {
      plVar6 = *(lys_module **)(module->imp->rev + lVar5 + -0x10);
      if ((plVar6 != (lys_module *)0x0) && (plVar6->name == value)) {
        if (imp->rev[0] == '\0') goto LAB_00126a9c;
        if ((plVar6->rev_size != '\0') && (iVar2 = strcmp(plVar6->rev->date,imp->rev), iVar2 == 0))
        {
          imp->module = plVar6;
          return 0;
        }
        goto LAB_00126b89;
      }
      lVar5 = lVar5 + 0x38;
    } while ((ulong)module->imp_size * 0x38 - lVar5 != 0);
  }
  plVar6 = (lys_module *)0x0;
LAB_00126a9c:
  iVar2 = lyp_check_circmod((lys_module *)module->ctx,module->name,(int)value);
  if (iVar2 != 0) {
    return -1;
  }
  revision = imp->rev;
  if (imp->rev[0] == '\0') {
    revision = (char *)0x0;
  }
  plVar3 = ly_ctx_load_sub_module
                     (module->ctx,(lys_module *)0x0,value,revision,(module->ctx->models).flags & 1,
                      (unres_schema *)0x0);
  imp->module = plVar3;
  if (plVar3 == (lys_module *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EVALID;
    ly_log(LY_LLERR,"Importing \"%s\" module into \"%s\" failed.",value,module->name);
    return -1;
  }
  if (plVar6 == (lys_module *)0x0) {
    return 0;
  }
  if (plVar6 == plVar3) {
    uVar1 = plVar6->rev_size;
    if (uVar1 == plVar3->rev_size) {
      if (uVar1 == '\0') {
        return 0;
      }
    }
    else if ((uVar1 == '\0') || (plVar3->rev_size != '\0')) goto LAB_00126b89;
    iVar2 = strcmp(plVar6->rev->date,plVar3->rev->date);
    if (iVar2 == 0) {
      return 0;
    }
  }
LAB_00126b89:
  ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"import");
  ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Importing multiple revisions of module \"%s\".",value);
  return -1;
}

Assistant:

int
lyp_check_import(struct lys_module *module, const char *value, struct lys_import *imp)
{
    int i;
    struct lys_module *dup = NULL;

    /* check for importing a single module in multiple revisions */
    for (i = 0; i < module->imp_size; i++) {
        if (!module->imp[i].module) {
            /* skip the not yet filled records */
            continue;
        }
        if (ly_strequal(module->imp[i].module->name, value, 1)) {
            /* check revisions, including multiple revisions of a single module is error */
            if (imp->rev[0] && (!module->imp[i].module->rev_size || strcmp(module->imp[i].module->rev[0].date, imp->rev))) {
                /* the already imported module has
                 * - no revision, but here we require some
                 * - different revision than the one required here */
                LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "import");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Importing multiple revisions of module \"%s\".", value);
                return -1;
            } else if (!imp->rev[0]) {
                /* no revision, remember the duplication, but check revisions after loading the module
                 * because the current revision can be the same (then it is ok) or it can differ (then it
                 * is error */
                dup = module->imp[i].module;
                break;
            }

            /* there is duplication, but since prefixes differs (checked in caller of this function),
             * it is ok */
            imp->module = module->imp[i].module;
            return 0;
        }
    }

    /* circular import check */
    if (lyp_check_circmod(module, value, 1)) {
        return -1;
    }

    /* load module - in specific situations it tries to get the module from the context */
    imp->module = (struct lys_module *)ly_ctx_load_sub_module(module->ctx, NULL, value, imp->rev[0] ? imp->rev : NULL,
                                                              module->ctx->models.flags & LY_CTX_ALLIMPLEMENTED ? 1 : 0,
                                                              NULL);

    /* check the result */
    if (!imp->module) {
        LOGERR(LY_EVALID, "Importing \"%s\" module into \"%s\" failed.", value, module->name);
        return -1;
    }

    if (dup) {
        /* check the revisions */
        if ((dup != imp->module) ||
                (dup->rev_size != imp->module->rev_size && (!dup->rev_size || imp->module->rev_size)) ||
                (dup->rev_size && strcmp(dup->rev[0].date, imp->module->rev[0].date))) {
            /* - modules are not the same
             * - one of modules has no revision (except they both has no revision)
             * - revisions of the modules are not the same */
            LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "import");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Importing multiple revisions of module \"%s\".", value);
            return -1;
        }
    }

    return 0;
}